

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_order.cpp
# Opt level: O2

void __thiscall duckdb::OrderMergeEvent::Schedule(OrderMergeEvent *this)

{
  int32_t val;
  Pipeline *this_00;
  TaskScheduler *this_01;
  unsigned_long uVar1;
  bool bVar2;
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_true> merge_tasks;
  long *local_90;
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  local_88;
  ClientContext *local_70;
  enable_shared_from_this<duckdb::Event> local_68;
  shared_ptr<duckdb::Task,_true> local_58;
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  local_48;
  
  this_00 = shared_ptr<duckdb::Pipeline,_true>::operator->
                      (&(this->super_BasePipelineEvent).pipeline);
  local_70 = Pipeline::GetClientContext(this_00);
  this_01 = TaskScheduler::GetScheduler(local_70);
  val = TaskScheduler::NumberOfThreads(this_01);
  uVar1 = NumericCastImpl<unsigned_long,_int,_false>::Convert(val);
  local_88.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  while (bVar2 = uVar1 != 0, uVar1 = uVar1 - 1, bVar2) {
    enable_shared_from_this<duckdb::Event>::shared_from_this(&local_68);
    make_uniq<duckdb::PhysicalOrderMergeTask,duckdb::shared_ptr<duckdb::Event,true>,duckdb::ClientContext&,duckdb::OrderGlobalSinkState&,duckdb::PhysicalOperator_const&>
              ((duckdb *)&local_90,(shared_ptr<duckdb::Event,_true> *)&local_68,local_70,
               this->gstate,this->op);
    shared_ptr<duckdb::Task,_true>::
    shared_ptr<duckdb::PhysicalOrderMergeTask,_std::default_delete<duckdb::PhysicalOrderMergeTask>,_true,_0>
              (&local_58,
               (unique_ptr<duckdb::PhysicalOrderMergeTask,_std::default_delete<duckdb::PhysicalOrderMergeTask>,_true>
                *)&local_90);
    ::std::
    vector<duckdb::shared_ptr<duckdb::Task,true>,std::allocator<duckdb::shared_ptr<duckdb::Task,true>>>
    ::emplace_back<duckdb::shared_ptr<duckdb::Task,true>>
              ((vector<duckdb::shared_ptr<duckdb::Task,true>,std::allocator<duckdb::shared_ptr<duckdb::Task,true>>>
                *)&local_88,&local_58);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_58.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    if (local_90 != (long *)0x0) {
      (**(code **)(*local_90 + 8))();
    }
    local_90 = (long *)0x0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_68.__weak_this_.internal.
                super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  local_48.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_88.
       super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_88.
       super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_48.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_88.
       super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_88.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Event::SetTasks((Event *)this,(vector<duckdb::shared_ptr<duckdb::Task,_true>,_true> *)&local_48);
  ::std::
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ::~vector(&local_48);
  ::std::
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ::~vector(&local_88);
  return;
}

Assistant:

void Schedule() override {
		auto &context = pipeline->GetClientContext();

		// Schedule tasks equal to the number of threads, which will each merge multiple partitions
		auto &ts = TaskScheduler::GetScheduler(context);
		auto num_threads = NumericCast<idx_t>(ts.NumberOfThreads());

		vector<shared_ptr<Task>> merge_tasks;
		for (idx_t tnum = 0; tnum < num_threads; tnum++) {
			merge_tasks.push_back(make_uniq<PhysicalOrderMergeTask>(shared_from_this(), context, gstate, op));
		}
		SetTasks(std::move(merge_tasks));
	}